

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

TEXTURE_FORMAT __thiscall
Diligent::VkFormatToTexFormatMapper::operator[](VkFormatToTexFormatMapper *this,VkFormat VkFmt)

{
  TEXTURE_FORMAT TVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  VkFormat local_c;
  
  if ((int)VkFmt < 0xb9) {
    TVar1 = this->m_VkFmtToTexFmtMap[VkFmt];
  }
  else {
    p_Var3 = (_Hash_node_base *)0x0;
    local_c = VkFmt;
    p_Var2 = std::
             _Hashtable<VkFormat,_std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>,_std::allocator<std::pair<const_VkFormat,_Diligent::TEXTURE_FORMAT>_>,_std::__detail::_Select1st,_std::equal_to<VkFormat>,_std::hash<VkFormat>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&(this->m_VkFmtToTexFmtMapExt)._M_h,
                        (ulong)VkFmt % (this->m_VkFmtToTexFmtMapExt)._M_h._M_bucket_count,&local_c,
                        (ulong)VkFmt);
    if (p_Var2 != (__node_base_ptr)0x0) {
      p_Var3 = p_Var2->_M_nxt;
    }
    if (p_Var3 == (_Hash_node_base *)0x0) {
      TVar1 = TEX_FORMAT_UNKNOWN;
    }
    else {
      TVar1 = *(TEXTURE_FORMAT *)((long)&p_Var3[1]._M_nxt + 4);
    }
  }
  return TVar1;
}

Assistant:

TEXTURE_FORMAT operator[](VkFormat VkFmt) const
    {
        if (VkFmt < VK_FORMAT_RANGE_SIZE)
        {
            return m_VkFmtToTexFmtMap[VkFmt];
        }
        else
        {
            auto it = m_VkFmtToTexFmtMapExt.find(VkFmt);
            return it != m_VkFmtToTexFmtMapExt.end() ? it->second : TEX_FORMAT_UNKNOWN;
        }
    }